

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.h
# Opt level: O3

bool __thiscall
spvtools::val::ValidationState_t::LogicallyMatch
          (ValidationState_t *this,Instruction *lhs,Instruction *rhs,bool check_decorations)

{
  bool bVar1;
  uint16_t uVar2;
  uint uVar3;
  uint uVar4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  _Rb_tree_const_iterator<spvtools::val::Decoration> __it;
  _Base_ptr p_Var7;
  iterator iVar8;
  ulong uVar9;
  undefined7 in_register_00000009;
  Instruction *pIVar10;
  undefined4 uVar11;
  _Rb_tree_header *p_Var12;
  size_t index;
  _Rb_tree_header *p_Var13;
  _Rb_tree_node_base *local_58;
  ValidationState_t *local_50;
  undefined8 local_48;
  undefined4 local_3c;
  mapped_type *local_38;
  
  uVar2 = (lhs->inst_).opcode;
  if (uVar2 != (rhs->inst_).opcode) {
    return false;
  }
  uVar11 = (undefined4)CONCAT71(in_register_00000009,check_decorations);
  if (check_decorations) {
    local_50 = this;
    local_3c = uVar11;
    local_58._0_4_ = (lhs->inst_).result_id;
    pmVar5 = std::
             map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
             ::operator[](&this->id_decorations_,(key_type *)&local_58);
    local_58 = (_Rb_tree_node_base *)CONCAT44(local_58._4_4_,(rhs->inst_).result_id);
    local_48 = rhs;
    pmVar6 = std::
             map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
             ::operator[](&this->id_decorations_,(key_type *)&local_58);
    p_Var7 = (pmVar6->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var12 = &(pmVar6->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var7 != p_Var12) {
      p_Var13 = &(pmVar5->_M_t)._M_impl.super__Rb_tree_header;
      local_38 = pmVar5;
      do {
        local_58 = p_Var7 + 1;
        __it._M_node = (local_38->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        while( true ) {
          if ((_Rb_tree_header *)__it._M_node == p_Var13) {
            return false;
          }
          bVar1 = __gnu_cxx::__ops::_Iter_equals_val<spvtools::val::Decoration_const>::operator()
                            ((_Iter_equals_val<spvtools::val::Decoration_const> *)&local_58,__it);
          if (bVar1) break;
          __it._M_node = (_Base_ptr)std::_Rb_tree_increment(__it._M_node);
        }
        if ((_Rb_tree_header *)__it._M_node == p_Var13) {
          return false;
        }
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
      } while ((_Rb_tree_header *)p_Var7 != p_Var12);
    }
    uVar2 = (lhs->inst_).opcode;
    rhs = local_48;
    this = local_50;
    uVar11 = local_3c;
  }
  if (uVar2 == 0x1e) {
    uVar9 = (long)(lhs->operands_).
                  super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(lhs->operands_).
                  super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    if (uVar9 == (long)(rhs->operands_).
                       super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(rhs->operands_).
                       super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                       ._M_impl.super__Vector_impl_data._M_start) {
      if (0x10 < uVar9) {
        local_50 = (ValidationState_t *)&this->all_definitions_;
        index = 1;
        local_48 = (Instruction *)(CONCAT44(local_48._4_4_,uVar11) & 0xffffffff000000ff);
        do {
          uVar3 = Instruction::GetOperandAs<unsigned_int>(lhs,index);
          uVar4 = Instruction::GetOperandAs<unsigned_int>(rhs,index);
          if (uVar3 != uVar4) {
            local_58._0_4_ = uVar3;
            iVar8 = std::
                    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                            *)local_50,(key_type *)&local_58);
            if (iVar8.
                super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
                ._M_cur == (__node_type *)0x0) {
              pIVar10 = (Instruction *)0x0;
            }
            else {
              pIVar10 = *(Instruction **)
                         ((long)iVar8.
                                super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
                                ._M_cur + 0x10);
            }
            local_58 = (_Rb_tree_node_base *)CONCAT44(local_58._4_4_,uVar4);
            iVar8 = std::
                    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                            *)local_50,(key_type *)&local_58);
            if (iVar8.
                super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
                ._M_cur == (__node_type *)0x0) {
              return false;
            }
            if (pIVar10 == (Instruction *)0x0) {
              return false;
            }
            if (*(Instruction **)
                 ((long)iVar8.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
                        ._M_cur + 0x10) == (Instruction *)0x0) {
              return false;
            }
            bVar1 = LogicallyMatch(this,pIVar10,
                                   *(Instruction **)
                                    ((long)iVar8.
                                           super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
                                           ._M_cur + 0x10),SUB81(local_48,0));
            if (!bVar1) {
              return false;
            }
          }
          index = index + 1;
        } while (index < (ulong)((long)(lhs->operands_).
                                       super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(lhs->operands_).
                                       super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 4));
      }
      return true;
    }
  }
  else if (uVar2 == 0x1c) {
    uVar3 = Instruction::GetOperandAs<unsigned_int>(lhs,2);
    uVar4 = Instruction::GetOperandAs<unsigned_int>(rhs,2);
    if (uVar3 == uVar4) {
      uVar3 = Instruction::GetOperandAs<unsigned_int>(lhs,1);
      uVar4 = Instruction::GetOperandAs<unsigned_int>(rhs,1);
      if (uVar3 == uVar4) {
        return true;
      }
      local_58._0_4_ = uVar3;
      iVar8 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->all_definitions_)._M_h,(key_type *)&local_58);
      if (iVar8.
          super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
          ._M_cur == (__node_type *)0x0) {
        pIVar10 = (Instruction *)0x0;
      }
      else {
        pIVar10 = *(Instruction **)
                   ((long)iVar8.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
                          ._M_cur + 0x10);
      }
      local_58 = (_Rb_tree_node_base *)CONCAT44(local_58._4_4_,uVar4);
      iVar8 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->all_definitions_)._M_h,(key_type *)&local_58);
      if ((iVar8.
           super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
           ._M_cur != (__node_type *)0x0) &&
         (*(Instruction **)
           ((long)iVar8.
                  super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
                  ._M_cur + 0x10) != (Instruction *)0x0 && pIVar10 != (Instruction *)0x0)) {
        bVar1 = LogicallyMatch(this,pIVar10,
                               *(Instruction **)
                                ((long)iVar8.
                                       super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
                                       ._M_cur + 0x10),SUB41(uVar11,0));
        return bVar1;
      }
    }
  }
  return false;
}

Assistant:

spv::Op opcode() const { return static_cast<spv::Op>(inst_.opcode); }